

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void telnet_special(Backend *be,SessionSpecialCode code,int arg)

{
  BackendVtable *pBVar1;
  Interactor *pIVar2;
  undefined8 uVar3;
  uchar *puVar4;
  uchar b [2];
  undefined1 local_12;
  undefined1 local_11;
  
  pBVar1 = be[-10].vt;
  if (pBVar1 == (BackendVtable *)0x0) {
    return;
  }
  switch(code) {
  case SS_BRK:
    break;
  case SS_EOF:
    break;
  case SS_PING:
    if (*(int *)((long)&be[-5].vt + 4) != 1) {
      return;
    }
  case SS_NOP:
    break;
  case SS_AYT:
    break;
  case SS_SYNCH:
    pIVar2 = (Interactor *)(**(code **)(pBVar1->init + 0x10))(pBVar1,&local_12,1);
    be[-4].interactor = pIVar2;
    pIVar2 = (Interactor *)(**(code **)((be[-10].vt)->init + 0x18))(be[-10].vt,&local_11,1);
    goto LAB_0013b804;
  case SS_EC:
    break;
  case SS_EL:
    break;
  case SS_GA:
    break;
  case SS_ABORT:
    break;
  case SS_AO:
    break;
  case SS_IP:
    break;
  case SS_SUSP:
    break;
  case SS_EOR:
    break;
  case SS_EOL:
    if (*(int *)&be[-5].interactor == 1) {
      puVar4 = "\r";
      uVar3 = 1;
    }
    else {
      puVar4 = "\r\n";
      uVar3 = 2;
    }
    pIVar2 = (Interactor *)(**(code **)(pBVar1->init + 0x10))(pBVar1,puVar4,uVar3);
    goto LAB_0013b804;
  default:
    goto switchD_0013b706_default;
  }
  pIVar2 = (Interactor *)(**(code **)(pBVar1->init + 0x10))(pBVar1,&local_12,2);
LAB_0013b804:
  be[-4].interactor = pIVar2;
switchD_0013b706_default:
  return;
}

Assistant:

static void telnet_special(Backend *be, SessionSpecialCode code, int arg)
{
    Telnet *telnet = container_of(be, Telnet, backend);
    unsigned char b[2];

    if (telnet->s == NULL)
        return;

    b[0] = IAC;
    switch (code) {
      case SS_AYT:
        b[1] = AYT;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_BRK:
        b[1] = BREAK;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EC:
        b[1] = EC;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EL:
        b[1] = EL;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_GA:
        b[1] = GA;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_NOP:
        b[1] = NOP;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_ABORT:
        b[1] = ABORT;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_AO:
        b[1] = AO;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_IP:
        b[1] = IP;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_SUSP:
        b[1] = SUSP;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EOR:
        b[1] = EOR;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EOF:
        b[1] = xEOF;
        telnet->bufsize = sk_write(telnet->s, b, 2);
        break;
      case SS_EOL:
        /* In BINARY mode, CR-LF becomes just CR -
         * and without the NUL suffix too. */
        if (telnet->opt_states[o_we_bin.index] == ACTIVE)
            telnet->bufsize = sk_write(telnet->s, "\r", 1);
        else
            telnet->bufsize = sk_write(telnet->s, "\r\n", 2);
        break;
      case SS_SYNCH:
        b[1] = DM;
        telnet->bufsize = sk_write(telnet->s, b, 1);
        telnet->bufsize = sk_write_oob(telnet->s, b + 1, 1);
        break;
      case SS_PING:
        if (telnet->opt_states[o_they_sga.index] == ACTIVE) {
            b[1] = NOP;
            telnet->bufsize = sk_write(telnet->s, b, 2);
        }
        break;
      default:
        break;  /* never heard of it */
    }
}